

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

void * parasail_memalign(size_t alignment,size_t size)

{
  int iVar1;
  void *ptr;
  void *local_8;
  
  local_8 = (void *)0x0;
  iVar1 = posix_memalign(&local_8,alignment,size);
  if (iVar1 == 0) {
    if (local_8 == (void *)0x0) {
      fprintf(_stderr,"%s: failed\n","parasail_memalign");
    }
  }
  else {
    parasail_memalign_cold_1();
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

void* parasail_memalign(size_t alignment, size_t size)
{
    void *ptr = NULL;
#if defined(HAVE__ALIGNED_MALLOC)
    ptr = _aligned_malloc(size, alignment);
#elif defined(HAVE_POSIX_MEMALIGN)
    int retcode = posix_memalign(&ptr, alignment, size);
    if (0 != retcode) {
        fprintf(stderr, "%s: posix_memalign failed: %s\n",
                __func__, strerror(retcode));
        return NULL;
    }
#elif defined(HAVE_ALIGNED_ALLOC)
    ptr = aligned_alloc(alignment, size);
#elif defined(HAVE_MEMALIGN)
    ptr = memalign(alignment, size);
#else
#error "No suitable memory alignment routine found."
#endif
    if (NULL == ptr) {
        fprintf(stderr, "%s: failed\n", __func__);
    }
    return ptr;
}